

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

void Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
               (ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator,
               ParseNodeVisitor<FuncInfo> prefix,ParseNodeVisitor<FuncInfo> postfix,
               ParseNode *pnodeParent)

{
  OpCode OVar1;
  code *pcVar2;
  ParseNodeVisitor<FuncInfo> postfix_00;
  ParseNodeVisitor<FuncInfo> postfix_01;
  bool bVar3;
  uint uVar4;
  ParseNodeVar *pPVar5;
  ParseNodeForInOrForOf *pPVar6;
  ParseNodeWhile *pPVar7;
  ParseNodeBin *pPVar8;
  ParseNodeSuperReference *pPVar9;
  ParseNodeTryFinally *pPVar10;
  ParseNodeTryCatch *pPVar11;
  ParseNodeStrTemplate *pPVar12;
  ParseNodeIf *pPVar13;
  ParseNodeParamPattern *pPVar14;
  ParseNodeCase *pPVar15;
  ParseNodeBlock *pPVar16;
  ParseNode *pPVar17;
  ParseNodeWith *pPVar18;
  ParseNodeTri *pPVar19;
  ParseNodeFnc *pPVar20;
  undefined4 *puVar21;
  ParseNodeProg *pPVar22;
  ParseNodeTry *pPVar23;
  ParseNodeCall *pPVar24;
  SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *pSVar25;
  Type *ppPVar26;
  ParseNodeSuperCall *pPVar27;
  ParseNodeFor *pPVar28;
  ParseNodeClass *pPVar29;
  ParseNodeSwitch *pPVar30;
  ParseNodeCatch *pPVar31;
  ParseNodeReturn *pPVar32;
  ParseNodeUni *pPVar33;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_FuncInfo_ptr *p_Var34;
  FuncInfo *pFVar35;
  FuncInfo *pFVar36;
  ParseNodeVisitor<FuncInfo> prefix_00;
  ParseNodeVisitor<FuncInfo> prefix_01;
  ParseNodeVisitor<FuncInfo> prefix_02;
  ParseNodeVisitor<FuncInfo> prefix_03;
  ParseNodeVisitor<FuncInfo> prefix_04;
  ParseNodeVisitor<FuncInfo> prefix_05;
  ParseNodeVisitor<FuncInfo> prefix_06;
  ParseNodeVisitor<FuncInfo> prefix_07;
  ParseNodeVisitor<FuncInfo> prefix_08;
  ParseNodeVisitor<FuncInfo> prefix_09;
  ParseNodeVisitor<FuncInfo> prefix_10;
  ParseNodeVisitor<FuncInfo> prefix_11;
  ParseNodeVisitor<FuncInfo> prefix_12;
  ParseNodeVisitor<FuncInfo> prefix_13;
  ParseNodeVisitor<FuncInfo> prefix_14;
  ParseNodeVisitor<FuncInfo> prefix_15;
  ParseNodeVisitor<FuncInfo> prefix_16;
  ParseNodeVisitor<FuncInfo> prefix_17;
  ParseNodeVisitor<FuncInfo> prefix_18;
  ParseNodeVisitor<FuncInfo> prefix_19;
  ParseNodeVisitor<FuncInfo> prefix_20;
  ParseNodeVisitor<FuncInfo> prefix_21;
  ParseNodeVisitor<FuncInfo> prefix_22;
  ParseNodeVisitor<FuncInfo> prefix_23;
  ParseNodeVisitor<FuncInfo> prefix_24;
  ParseNodeVisitor<FuncInfo> prefix_25;
  ParseNodeVisitor<FuncInfo> prefix_26;
  ParseNodeVisitor<FuncInfo> prefix_27;
  ParseNodeVisitor<FuncInfo> prefix_28;
  ParseNodeVisitor<FuncInfo> prefix_29;
  ParseNodeVisitor<FuncInfo> prefix_30;
  ParseNodeVisitor<FuncInfo> prefix_31;
  ParseNodeVisitor<FuncInfo> prefix_32;
  ParseNodeVisitor<FuncInfo> prefix_33;
  ParseNodeVisitor<FuncInfo> prefix_34;
  ParseNodeVisitor<FuncInfo> prefix_35;
  ParseNodeVisitor<FuncInfo> prefix_36;
  ParseNodeVisitor<FuncInfo> prefix_37;
  ParseNodeVisitor<FuncInfo> prefix_38;
  ParseNodeVisitor<FuncInfo> prefix_39;
  ParseNodeVisitor<FuncInfo> prefix_40;
  ParseNodeVisitor<FuncInfo> prefix_41;
  ParseNodeVisitor<FuncInfo> prefix_42;
  ParseNodeVisitor<FuncInfo> prefix_43;
  ParseNodeVisitor<FuncInfo> postfix_02;
  ParseNodeVisitor<FuncInfo> postfix_03;
  ParseNodeVisitor<FuncInfo> postfix_04;
  ParseNodeVisitor<FuncInfo> postfix_05;
  ParseNodeVisitor<FuncInfo> postfix_06;
  ParseNodeVisitor<FuncInfo> postfix_07;
  ParseNodeVisitor<FuncInfo> postfix_08;
  ParseNodeVisitor<FuncInfo> postfix_09;
  ParseNodeVisitor<FuncInfo> postfix_10;
  ParseNodeVisitor<FuncInfo> postfix_11;
  ParseNodeVisitor<FuncInfo> postfix_12;
  ParseNodeVisitor<FuncInfo> postfix_13;
  ParseNodeVisitor<FuncInfo> postfix_14;
  ParseNodeVisitor<FuncInfo> postfix_15;
  ParseNodeVisitor<FuncInfo> postfix_16;
  ParseNodeVisitor<FuncInfo> postfix_17;
  ParseNodeVisitor<FuncInfo> postfix_18;
  ParseNodeVisitor<FuncInfo> postfix_19;
  ParseNodeVisitor<FuncInfo> postfix_20;
  ParseNodeVisitor<FuncInfo> postfix_21;
  ParseNodeVisitor<FuncInfo> postfix_22;
  ParseNodeVisitor<FuncInfo> postfix_23;
  ParseNodeVisitor<FuncInfo> postfix_24;
  ParseNodeVisitor<FuncInfo> postfix_25;
  ParseNodeVisitor<FuncInfo> postfix_26;
  ParseNodeVisitor<FuncInfo> postfix_27;
  ParseNodeVisitor<FuncInfo> postfix_28;
  ParseNodeVisitor<FuncInfo> postfix_29;
  ParseNodeVisitor<FuncInfo> postfix_30;
  ParseNodeVisitor<FuncInfo> postfix_31;
  ParseNodeVisitor<FuncInfo> postfix_32;
  ParseNodeVisitor<FuncInfo> postfix_33;
  ParseNodeVisitor<FuncInfo> postfix_34;
  ParseNodeVisitor<FuncInfo> postfix_35;
  ParseNodeVisitor<FuncInfo> postfix_36;
  ParseNodeVisitor<FuncInfo> postfix_37;
  ParseNodeVisitor<FuncInfo> postfix_38;
  ParseNodeVisitor<FuncInfo> postfix_39;
  ParseNodeVisitor<FuncInfo> postfix_40;
  ParseNodeVisitor<FuncInfo> postfix_41;
  ParseNodeVisitor<FuncInfo> postfix_42;
  ParseNodeVisitor<FuncInfo> postfix_43;
  ParseNodeVisitor<FuncInfo> postfix_44;
  SListNodeBase<Memory::ArenaAllocator> local_70;
  uint i;
  ArenaAllocator *local_60;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_FuncInfo_ptr *local_58;
  ByteCodeGenerator *local_50;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_FuncInfo_ptr *local_48;
  FuncInfo *local_40;
  FuncInfo *local_38;
  
  postfix_02.m_fn = postfix.m_fn;
  local_40 = postfix.m_context;
  prefix_02.m_fn = prefix.m_fn;
  pFVar35 = prefix.m_context;
  if (pnode == (ParseNode *)0x0) {
    return;
  }
  ThreadContext::ProbeCurrentStackNoDispose(0x2400,byteCodeGenerator->scriptContext);
  if (prefix_02.m_fn != (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_FuncInfo_ptr *)0x0) {
    (*prefix_02.m_fn)(pnode,byteCodeGenerator,pFVar35);
  }
  OVar1 = pnode->nop;
  local_38 = pFVar35;
  p_Var34 = prefix_02.m_fn;
  pPVar17 = pnode;
  switch(OVar1) {
  case knopCall:
    pPVar24 = ParseNode::AsParseNodeCall(pnode);
    pFVar36 = local_38;
    pFVar35 = local_40;
    prefix_24.m_fn = prefix_02.m_fn;
    prefix_24.m_context = local_38;
    postfix_25.m_fn = postfix_02.m_fn;
    postfix_25.m_context = local_40;
    local_50 = byteCodeGenerator;
    local_48 = postfix_02.m_fn;
    Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              (pPVar24->pnodeTarget,byteCodeGenerator,prefix_24,postfix_25,(ParseNode *)0x0);
    pPVar24 = ParseNode::AsParseNodeCall(pnode);
    postfix_02.m_fn = local_48;
    byteCodeGenerator = local_50;
    prefix_25.m_fn = prefix_02.m_fn;
    prefix_25.m_context = pFVar36;
    postfix_26.m_fn = local_48;
    postfix_26.m_context = pFVar35;
    Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              (pPVar24->pnodeArgs,local_50,prefix_25,postfix_26,(ParseNode *)0x0);
    pPVar24 = ParseNode::AsParseNodeCall(pnode);
    if ((pPVar24->field_0x24 & 8) == 0) goto switchD_00835e1a_caseD_55;
    pPVar27 = ParseNode::AsParseNodeSuperCall(pnode);
    pFVar35 = local_38;
    pFVar36 = local_40;
    prefix_26.m_fn = prefix_02.m_fn;
    prefix_26.m_context = local_38;
    postfix_27.m_fn = local_48;
    postfix_27.m_context = local_40;
    Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              ((ParseNode *)pPVar27->pnodeThis,local_50,prefix_26,postfix_27,(ParseNode *)0x0);
    pPVar27 = ParseNode::AsParseNodeSuperCall(pnode);
    pPVar16 = (ParseNodeBlock *)pPVar27->pnodeNewTarget;
    postfix_02.m_fn = local_48;
    byteCodeGenerator = local_50;
    pPVar17 = (ParseNode *)0x0;
    break;
  case knopDot:
  case knopAsg:
  case knopInstOf:
  case knopIn:
  case knopEqv:
  case knopNEqv:
  case knopLogOr:
  case knopLogAnd:
  case knopCoalesce:
  case knopLsh:
  case knopRsh:
  case knopRs2:
  case knopIndex:
  case knopAsgAdd:
  case knopAsgSub:
  case knopAsgMul:
  case knopAsgDiv:
  case knopAsgExpo:
  case knopAsgMod:
  case knopAsgAnd:
  case knopAsgXor:
  case knopAsgOr:
  case knopAsgLsh:
  case knopAsgRsh:
  case knopAsgRs2:
  case knopMember:
  case knopMemberShort:
  case knopSetMember:
  case knopGetMember:
  case knopTemp:
  case knopModule:
  case knopEndCode:
  case knopDebugger:
  case knopObjectPattern:
  case knopObjectPatternMember:
switchD_00835e1a_caseD_30:
    uVar4 = ParseNode::Grfnop((uint)OVar1);
    if ((uVar4 & 4) != 0) goto switchD_00835e1a_caseD_6d;
    if ((uVar4 & 8) == 0) goto switchD_00835e1a_caseD_55;
    pPVar8 = ParseNode::AsParseNodeBin(pnode);
    pFVar36 = local_38;
    pFVar35 = local_40;
    prefix_07.m_fn = prefix_02.m_fn;
    prefix_07.m_context = local_38;
    postfix_07.m_fn = postfix_02.m_fn;
    postfix_07.m_context = local_40;
    local_50 = (ByteCodeGenerator *)pnode;
    Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              (pPVar8->pnode1,byteCodeGenerator,prefix_07,postfix_07,(ParseNode *)0x0);
    pPVar8 = ParseNode::AsParseNodeBin((ParseNode *)local_50);
    pnode = (ParseNode *)local_50;
    prefix_08.m_fn = prefix_02.m_fn;
    prefix_08.m_context = pFVar36;
    postfix_08.m_fn = postfix_02.m_fn;
    postfix_08.m_context = pFVar35;
    Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              (pPVar8->pnode2,byteCodeGenerator,prefix_08,postfix_08,(ParseNode *)0x0);
    pPVar8 = ParseNode::AsParseNodeBin(pnode);
    bVar3 = ByteCodeGenerator::IsSuper(pPVar8->pnode1);
    if (!bVar3) goto switchD_00835e1a_caseD_55;
    pPVar9 = ParseNode::AsParseNodeSuperReference(pnode);
    goto LAB_00836a8f;
  case knopComma:
    local_48 = postfix_02.m_fn;
    pPVar8 = ParseNode::AsParseNodeBin(pnode);
    pFVar36 = local_38;
    pFVar35 = local_40;
    postfix_02.m_fn = local_48;
    pPVar17 = pPVar8->pnode1;
    if (pPVar17->nop == knopComma) {
      local_60 = byteCodeGenerator->alloc;
      i = 0;
      local_70.next = (Type)&stack0xffffffffffffff90;
      local_58 = prefix_02.m_fn;
      do {
        pPVar8 = ParseNode::AsParseNodeBin(pPVar17);
        pSVar25 = (SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)
                  new<Memory::ArenaAllocator>(0x10,local_60,0x364470);
        *(ParseNodePtr *)&pSVar25->super_RealCount = pPVar8->pnode2;
        (pSVar25->super_SListNodeBase<Memory::ArenaAllocator>).next = local_70.next;
        i = i + 1;
        local_70.next = (Type)pSVar25;
        pPVar8 = ParseNode::AsParseNodeBin(pPVar17);
        pPVar17 = pPVar8->pnode1;
      } while (pPVar17->nop == knopComma);
      prefix_22.m_fn = local_58;
      prefix_22.m_context = local_38;
      postfix_23.m_fn = local_48;
      postfix_23.m_context = local_40;
      Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
                (pPVar17,byteCodeGenerator,prefix_22,postfix_23,(ParseNode *)0x0);
      while ((SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)local_70.next !=
             (SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)&stack0xffffffffffffff90)
      {
        ppPVar26 = SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Head
                             ((SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)
                              &stack0xffffffffffffff90);
        pPVar17 = *ppPVar26;
        SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
                  ((SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)
                   &stack0xffffffffffffff90,local_60);
        prefix_23.m_fn = local_58;
        prefix_23.m_context = local_38;
        postfix_24.m_fn = local_48;
        postfix_24.m_context = local_40;
        Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
                  (pPVar17,byteCodeGenerator,prefix_23,postfix_24,(ParseNode *)0x0);
      }
      SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::~SList
                ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)&stack0xffffffffffffff90);
      pFVar35 = local_40;
      postfix_02.m_fn = local_48;
      pFVar36 = local_38;
    }
    else {
      prefix_42.m_fn = prefix_02.m_fn;
      prefix_42.m_context = local_38;
      postfix_43.m_fn = local_48;
      postfix_43.m_context = local_40;
      local_58 = prefix_02.m_fn;
      Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
                (pPVar17,byteCodeGenerator,prefix_42,postfix_43,(ParseNode *)0x0);
    }
    pPVar8 = ParseNode::AsParseNodeBin(pnode);
    prefix_43.m_fn = local_58;
    prefix_43.m_context = pFVar36;
    postfix_44.m_fn = postfix_02.m_fn;
    postfix_44.m_context = pFVar35;
    Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              (pPVar8->pnode2,byteCodeGenerator,prefix_43,postfix_44,(ParseNode *)0x0);
    goto switchD_00835e1a_caseD_55;
  case knopNew:
    pPVar24 = ParseNode::AsParseNodeCall(pnode);
    prefix_21.m_fn = prefix_02.m_fn;
    prefix_21.m_context = local_38;
    postfix_22.m_fn = postfix_02.m_fn;
    postfix_22.m_context = local_40;
    Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              (pPVar24->pnodeTarget,byteCodeGenerator,prefix_21,postfix_22,(ParseNode *)0x0);
    bVar3 = IsCallOfConstants(pnode);
    if (bVar3) goto switchD_00835e1a_caseD_55;
    pPVar24 = ParseNode::AsParseNodeCall(pnode);
    pPVar16 = (ParseNodeBlock *)pPVar24->pnodeArgs;
    goto LAB_008364c2;
  case knopQmark:
    pPVar19 = ParseNode::AsParseNodeTri(pnode);
    pFVar35 = local_38;
    pFVar36 = local_40;
    prefix_17.m_fn = prefix_02.m_fn;
    prefix_17.m_context = local_38;
    postfix_17.m_fn = postfix_02.m_fn;
    postfix_17.m_context = local_40;
    local_58 = prefix_02.m_fn;
    local_50 = (ByteCodeGenerator *)pnode;
    Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              (pPVar19->pnode1,byteCodeGenerator,prefix_17,postfix_17,(ParseNode *)0x0);
    pPVar19 = ParseNode::AsParseNodeTri((ParseNode *)local_50);
    prefix_18.m_fn = prefix_02.m_fn;
    prefix_18.m_context = pFVar35;
    postfix_18.m_fn = postfix_02.m_fn;
    postfix_18.m_context = pFVar36;
    Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              (pPVar19->pnode2,byteCodeGenerator,prefix_18,postfix_18,(ParseNode *)0x0);
    pPVar19 = ParseNode::AsParseNodeTri((ParseNode *)local_50);
    pPVar16 = (ParseNodeBlock *)pPVar19->pnode3;
    p_Var34 = local_58;
    pnode = (ParseNode *)local_50;
    pPVar17 = (ParseNode *)0x0;
    break;
  case knopList:
    postfix_21.m_fn = postfix_02.m_fn;
    postfix_21.m_context = local_40;
    VisitList<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              (pnode,byteCodeGenerator,prefix,postfix_21);
    goto switchD_00835e1a_caseD_55;
  case knopVarDecl:
  case knopConstDecl:
  case knopLetDecl:
    pPVar5 = ParseNode::AsParseNodeVar(pnode);
    if (pPVar5->pnodeInit == (ParseNodePtr)0x0) goto switchD_00835e1a_caseD_55;
    pPVar5 = ParseNode::AsParseNodeVar(pnode);
    pPVar16 = (ParseNodeBlock *)pPVar5->pnodeInit;
    goto LAB_008364c2;
  case knopFncDecl:
  case knopBreak:
  case knopContinue:
    goto switchD_00835e1a_caseD_55;
  case knopClassDecl:
    pPVar29 = ParseNode::AsParseNodeClass(pnode);
    pFVar36 = local_38;
    pFVar35 = local_40;
    prefix_31.m_fn = prefix_02.m_fn;
    prefix_31.m_context = local_38;
    postfix_32.m_fn = postfix_02.m_fn;
    postfix_32.m_context = local_40;
    local_58 = prefix_02.m_fn;
    local_48 = postfix_02.m_fn;
    Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              (&pPVar29->pnodeDeclName->super_ParseNode,byteCodeGenerator,prefix_31,postfix_32,
               (ParseNode *)0x0);
    pPVar29 = ParseNode::AsParseNodeClass(pnode);
    BeginVisitBlock(pPVar29->pnodeBlock,byteCodeGenerator);
    pPVar29 = ParseNode::AsParseNodeClass(pnode);
    p_Var34 = local_58;
    prefix_32.m_fn = local_58;
    prefix_32.m_context = pFVar36;
    postfix_33.m_fn = local_48;
    postfix_33.m_context = pFVar35;
    Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              (pPVar29->pnodeExtends,byteCodeGenerator,prefix_32,postfix_33,(ParseNode *)0x0);
    pPVar29 = ParseNode::AsParseNodeClass(pnode);
    prefix_33.m_fn = p_Var34;
    prefix_33.m_context = pFVar36;
    postfix_34.m_fn = local_48;
    postfix_34.m_context = pFVar35;
    Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              (&pPVar29->pnodeName->super_ParseNode,byteCodeGenerator,prefix_33,postfix_34,
               (ParseNode *)0x0);
    pPVar29 = ParseNode::AsParseNodeClass(pnode);
    prefix_34.m_fn = p_Var34;
    prefix_34.m_context = pFVar36;
    postfix_35.m_fn = local_48;
    postfix_35.m_context = pFVar35;
    Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              (&pPVar29->pnodeConstructor->super_ParseNode,byteCodeGenerator,prefix_34,postfix_35,
               (ParseNode *)0x0);
    pPVar29 = ParseNode::AsParseNodeClass(pnode);
    postfix_02.m_fn = local_48;
    prefix_35.m_fn = p_Var34;
    prefix_35.m_context = pFVar36;
    postfix_36.m_fn = local_48;
    postfix_36.m_context = pFVar35;
    Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              (pPVar29->pnodeMembers,byteCodeGenerator,prefix_35,postfix_36,(ParseNode *)0x0);
    pPVar29 = ParseNode::AsParseNodeClass(pnode);
    pPVar16 = pPVar29->pnodeBlock;
    goto LAB_008368f9;
  case knopProg:
    local_58 = prefix_02.m_fn;
    pPVar20 = ParseNode::AsParseNodeFnc(pnode);
    if (pPVar20->pnodeBody == (ParseNodePtr)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar21 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x152,"(pnode->AsParseNodeFnc()->pnodeBody)",
                         "pnode->AsParseNodeFnc()->pnodeBody");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar21 = 0;
    }
    local_70.next = (Type)((ulong)local_70.next._4_4_ << 0x20);
    pPVar20 = ParseNode::AsParseNodeFnc(pnode);
    pFVar35 = local_38;
    p_Var34 = local_58;
    postfix_01.m_fn = postfix_02.m_fn;
    postfix_01.m_context = local_40;
    prefix_01.m_fn = local_58;
    prefix_01.m_context = local_38;
    VisitNestedScopes<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              ((ParseNode *)pPVar20->pnodeScopes,pnode,byteCodeGenerator,prefix_01,postfix_01,
               (uint *)&stack0xffffffffffffff90,false);
    pPVar20 = ParseNode::AsParseNodeFnc(pnode);
    BeginVisitBlock(pPVar20->pnodeScopes,byteCodeGenerator);
    pPVar20 = ParseNode::AsParseNodeFnc(pnode);
    prefix_19.m_fn = p_Var34;
    prefix_19.m_context = pFVar35;
    postfix_19.m_fn = postfix_02.m_fn;
    postfix_19.m_context = local_40;
    pPVar17 = VisitBlock<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
                        (pPVar20->pnodeBody,byteCodeGenerator,prefix_19,postfix_19,(ParseNode *)0x0)
    ;
    pPVar22 = ParseNode::AsParseNodeProg(pnode);
    pPVar22->pnodeLastValStmt = pPVar17;
    pPVar20 = ParseNode::AsParseNodeFnc(pnode);
    pPVar16 = pPVar20->pnodeScopes;
    goto LAB_008368f9;
  case knopFor:
    pPVar28 = ParseNode::AsParseNodeFor(pnode);
    BeginVisitBlock(pPVar28->pnodeBlock,byteCodeGenerator);
    pPVar28 = ParseNode::AsParseNodeFor(pnode);
    pFVar36 = local_38;
    pFVar35 = local_40;
    prefix_27.m_fn = prefix_02.m_fn;
    prefix_27.m_context = local_38;
    postfix_28.m_fn = postfix_02.m_fn;
    postfix_28.m_context = local_40;
    local_50 = (ByteCodeGenerator *)pnode;
    local_48 = postfix_02.m_fn;
    Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              (pPVar28->pnodeInit,byteCodeGenerator,prefix_27,postfix_28,(ParseNode *)0x0);
    ByteCodeGenerator::EnterLoop(byteCodeGenerator);
    pPVar28 = ParseNode::AsParseNodeFor((ParseNode *)local_50);
    prefix_28.m_fn = prefix_02.m_fn;
    prefix_28.m_context = pFVar36;
    postfix_29.m_fn = local_48;
    postfix_29.m_context = pFVar35;
    Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              (pPVar28->pnodeCond,byteCodeGenerator,prefix_28,postfix_29,(ParseNode *)0x0);
    pPVar28 = ParseNode::AsParseNodeFor((ParseNode *)local_50);
    pnode = (ParseNode *)local_50;
    prefix_29.m_fn = prefix_02.m_fn;
    prefix_29.m_context = pFVar36;
    postfix_30.m_fn = local_48;
    postfix_30.m_context = pFVar35;
    Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              (pPVar28->pnodeIncr,byteCodeGenerator,prefix_29,postfix_30,(ParseNode *)0x0);
    pPVar28 = ParseNode::AsParseNodeFor(pnode);
    postfix_02.m_fn = local_48;
    prefix_30.m_fn = prefix_02.m_fn;
    prefix_30.m_context = pFVar36;
    postfix_31.m_fn = local_48;
    postfix_31.m_context = pFVar35;
    Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              (pPVar28->pnodeBody,byteCodeGenerator,prefix_30,postfix_31,pnode);
    byteCodeGenerator->loopDepth = byteCodeGenerator->loopDepth - 1;
    pPVar28 = ParseNode::AsParseNodeFor(pnode);
    pPVar16 = pPVar28->pnodeBlock;
    goto LAB_008368f9;
  case knopIf:
    pPVar13 = ParseNode::AsParseNodeIf(pnode);
    pFVar36 = local_38;
    pFVar35 = local_40;
    prefix_11.m_fn = prefix_02.m_fn;
    prefix_11.m_context = local_38;
    postfix_11.m_fn = postfix_02.m_fn;
    postfix_11.m_context = local_40;
    local_50 = byteCodeGenerator;
    Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              (pPVar13->pnodeCond,byteCodeGenerator,prefix_11,postfix_11,(ParseNode *)0x0);
    pPVar13 = ParseNode::AsParseNodeIf(pnode);
    byteCodeGenerator = local_50;
    prefix_12.m_fn = prefix_02.m_fn;
    prefix_12.m_context = pFVar36;
    postfix_12.m_fn = postfix_02.m_fn;
    postfix_12.m_context = pFVar35;
    Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              (pPVar13->pnodeTrue,local_50,prefix_12,postfix_12,pnode);
    pPVar13 = ParseNode::AsParseNodeIf(pnode);
    if (pPVar13->pnodeFalse == (ParseNodePtr)0x0) goto switchD_00835e1a_caseD_55;
    pPVar13 = ParseNode::AsParseNodeIf(pnode);
    pPVar16 = (ParseNodeBlock *)pPVar13->pnodeFalse;
    pFVar35 = local_38;
    pFVar36 = local_40;
    break;
  case knopWhile:
  case knopDoWhile:
    ByteCodeGenerator::EnterLoop(byteCodeGenerator);
    pPVar7 = ParseNode::AsParseNodeWhile(pnode);
    pFVar35 = local_40;
    prefix_05.m_fn = prefix_02.m_fn;
    prefix_05.m_context = local_38;
    postfix_05.m_fn = postfix_02.m_fn;
    postfix_05.m_context = local_40;
    Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              (pPVar7->pnodeCond,byteCodeGenerator,prefix_05,postfix_05,(ParseNode *)0x0);
    pPVar7 = ParseNode::AsParseNodeWhile(pnode);
    prefix_06.m_fn = prefix_02.m_fn;
    prefix_06.m_context = local_38;
    postfix_06.m_fn = postfix_02.m_fn;
    postfix_06.m_context = pFVar35;
    Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              (pPVar7->pnodeBody,byteCodeGenerator,prefix_06,postfix_06,pnode);
    byteCodeGenerator->loopDepth = byteCodeGenerator->loopDepth - 1;
    goto switchD_00835e1a_caseD_55;
  case knopForIn:
  case knopForOf:
  case knopForAwaitOf:
    pPVar6 = ParseNode::AsParseNodeForInOrForOf(pnode);
    BeginVisitBlock(pPVar6->pnodeBlock,byteCodeGenerator);
    pPVar6 = ParseNode::AsParseNodeForInOrForOf(pnode);
    pFVar36 = local_38;
    prefix_02.m_context = local_38;
    postfix_02.m_context = local_40;
    local_48 = postfix_02.m_fn;
    Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              (pPVar6->pnodeLval,byteCodeGenerator,prefix_02,postfix_02,(ParseNode *)0x0);
    pPVar6 = ParseNode::AsParseNodeForInOrForOf(pnode);
    pFVar35 = local_40;
    prefix_03.m_fn = prefix_02.m_fn;
    prefix_03.m_context = pFVar36;
    postfix_03.m_fn = local_48;
    postfix_03.m_context = local_40;
    Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              (pPVar6->pnodeObj,byteCodeGenerator,prefix_03,postfix_03,(ParseNode *)0x0);
    ByteCodeGenerator::EnterLoop(byteCodeGenerator);
    pPVar6 = ParseNode::AsParseNodeForInOrForOf(pnode);
    postfix_02.m_fn = local_48;
    prefix_04.m_fn = prefix_02.m_fn;
    prefix_04.m_context = pFVar36;
    postfix_04.m_fn = local_48;
    postfix_04.m_context = pFVar35;
    Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              (pPVar6->pnodeBody,byteCodeGenerator,prefix_04,postfix_04,pnode);
    byteCodeGenerator->loopDepth = byteCodeGenerator->loopDepth - 1;
    pPVar6 = ParseNode::AsParseNodeForInOrForOf(pnode);
    pPVar16 = pPVar6->pnodeBlock;
    goto LAB_008368f9;
  case knopBlock:
    pPVar16 = ParseNode::AsParseNodeBlock(pnode);
    if (pPVar16->pnodeStmt == (ParseNodePtr)0x0) {
      pPVar16->pnodeLastValStmt = (ParseNodePtr)0x0;
      goto switchD_00835e1a_caseD_55;
    }
    BeginVisitBlock(pPVar16,byteCodeGenerator);
    prefix_15.m_fn = prefix_02.m_fn;
    prefix_15.m_context = local_38;
    postfix_15.m_fn = postfix_02.m_fn;
    postfix_15.m_context = local_40;
    pPVar17 = VisitBlock<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
                        (pPVar16->pnodeStmt,byteCodeGenerator,prefix_15,postfix_15,pnode);
    pPVar16->pnodeLastValStmt = pPVar17;
LAB_008368f9:
    EndVisitBlock(pPVar16,byteCodeGenerator);
    goto switchD_00835e1a_caseD_55;
  case knopStrTemplate:
    pPVar12 = ParseNode::AsParseNodeStrTemplate(pnode);
    pFVar35 = local_38;
    if ((pPVar12->field_0x2a & 1) == 0) {
      pPVar12 = ParseNode::AsParseNodeStrTemplate(pnode);
      prefix_10.m_fn = prefix_02.m_fn;
      prefix_10.m_context = pFVar35;
      postfix_10.m_fn = postfix_02.m_fn;
      postfix_10.m_context = local_40;
      Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
                (pPVar12->pnodeStringLiterals,byteCodeGenerator,prefix_10,postfix_10,
                 (ParseNode *)0x0);
    }
    pPVar12 = ParseNode::AsParseNodeStrTemplate(pnode);
    pPVar16 = (ParseNodeBlock *)pPVar12->pnodeSubstitutionExpressions;
LAB_00836aa4:
    pFVar36 = local_40;
    pPVar17 = (ParseNode *)0x0;
    break;
  case knopWith:
    pPVar18 = ParseNode::AsParseNodeWith(pnode);
    pFVar35 = local_40;
    prefix_16.m_fn = prefix_02.m_fn;
    prefix_16.m_context = local_38;
    postfix_16.m_fn = postfix_02.m_fn;
    postfix_16.m_context = local_40;
    Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              (pPVar18->pnodeObj,byteCodeGenerator,prefix_16,postfix_16,(ParseNode *)0x0);
    pPVar18 = ParseNode::AsParseNodeWith(pnode);
    postfix_00.m_fn = postfix_02.m_fn;
    postfix_00.m_context = pFVar35;
    prefix_00.m_fn = prefix_02.m_fn;
    prefix_00.m_context = local_38;
    VisitWithStmt<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              (pnode,pPVar18->pnodeObj->location,byteCodeGenerator,prefix_00,postfix_00,pnode);
    goto switchD_00835e1a_caseD_55;
  case knopSwitch:
    pPVar30 = ParseNode::AsParseNodeSwitch(pnode);
    pFVar35 = local_40;
    prefix_36.m_fn = prefix_02.m_fn;
    prefix_36.m_context = local_38;
    postfix_37.m_fn = postfix_02.m_fn;
    postfix_37.m_context = local_40;
    local_48 = postfix_02.m_fn;
    Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              (pPVar30->pnodeVal,byteCodeGenerator,prefix_36,postfix_37,(ParseNode *)0x0);
    pPVar30 = ParseNode::AsParseNodeSwitch(pnode);
    BeginVisitBlock(pPVar30->pnodeBlock,byteCodeGenerator);
    pPVar30 = ParseNode::AsParseNodeSwitch(pnode);
    for (pPVar15 = pPVar30->pnodeCases; pPVar15 != (ParseNodeCase *)0x0;
        pPVar15 = pPVar15->pnodeNext) {
      prefix_37.m_fn = prefix_02.m_fn;
      prefix_37.m_context = local_38;
      postfix_38.m_fn = local_48;
      postfix_38.m_context = pFVar35;
      Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
                ((ParseNode *)pPVar15,byteCodeGenerator,prefix_37,postfix_38,pnode);
    }
    pPVar30 = ParseNode::AsParseNodeSwitch(pnode);
    postfix_02.m_fn = local_48;
    prefix_38.m_fn = prefix_02.m_fn;
    prefix_38.m_context = local_38;
    postfix_39.m_fn = local_48;
    postfix_39.m_context = pFVar35;
    Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              ((ParseNode *)pPVar30->pnodeBlock,byteCodeGenerator,prefix_38,postfix_39,
               (ParseNode *)0x0);
    pPVar30 = ParseNode::AsParseNodeSwitch(pnode);
    EndVisitBlock(pPVar30->pnodeBlock,byteCodeGenerator);
    goto switchD_00835e1a_caseD_55;
  case knopCase:
    pPVar15 = ParseNode::AsParseNodeCase(pnode);
    pFVar36 = local_40;
    prefix_13.m_fn = prefix_02.m_fn;
    prefix_13.m_context = local_38;
    postfix_13.m_fn = postfix_02.m_fn;
    postfix_13.m_context = local_40;
    Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              (pPVar15->pnodeExpr,byteCodeGenerator,prefix_13,postfix_13,(ParseNode *)0x0);
    pPVar15 = ParseNode::AsParseNodeCase(pnode);
    pPVar16 = pPVar15->pnodeBody;
    pFVar35 = local_38;
    break;
  case knopTryCatch:
    pPVar11 = ParseNode::AsParseNodeTryCatch(pnode);
    pFVar36 = local_40;
    prefix_14.m_fn = prefix_02.m_fn;
    prefix_14.m_context = local_38;
    postfix_14.m_fn = postfix_02.m_fn;
    postfix_14.m_context = local_40;
    Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              ((ParseNode *)pPVar11->pnodeTry,byteCodeGenerator,prefix_14,postfix_14,pnode);
    pPVar11 = ParseNode::AsParseNodeTryCatch(pnode);
    goto LAB_008361fd;
  case knopCatch:
    BeginVisitCatch(pnode,byteCodeGenerator);
    pPVar31 = ParseNode::AsParseNodeCatch(pnode);
    pFVar35 = local_40;
    prefix_39.m_fn = prefix_02.m_fn;
    prefix_39.m_context = local_38;
    postfix_40.m_fn = postfix_02.m_fn;
    postfix_40.m_context = local_40;
    Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              (pPVar31->pnodeParam,byteCodeGenerator,prefix_39,postfix_40,(ParseNode *)0x0);
    pPVar31 = ParseNode::AsParseNodeCatch(pnode);
    prefix_40.m_fn = prefix_02.m_fn;
    prefix_40.m_context = local_38;
    postfix_41.m_fn = postfix_02.m_fn;
    postfix_41.m_context = pFVar35;
    Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              (pPVar31->pnodeBody,byteCodeGenerator,prefix_40,postfix_41,pnode);
    EndVisitCatch(pnode,byteCodeGenerator);
    goto switchD_00835e1a_caseD_55;
  case knopReturn:
    pPVar32 = ParseNode::AsParseNodeReturn(pnode);
    if (pPVar32->pnodeExpr == (ParseNodePtr)0x0) goto switchD_00835e1a_caseD_55;
    pPVar9 = (ParseNodeSuperReference *)ParseNode::AsParseNodeReturn(pnode);
LAB_00836a8f:
    pPVar16 = (ParseNodeBlock *)pPVar9->pnodeThis;
    goto LAB_008364c2;
  case knopTry:
    pPVar23 = ParseNode::AsParseNodeTry(pnode);
    goto LAB_008364ac;
  case knopThrow:
    goto switchD_00835e1a_caseD_6d;
  case knopFinally:
    pPVar23 = (ParseNodeTry *)ParseNode::AsParseNodeFinally(pnode);
LAB_008364ac:
    pPVar16 = (ParseNodeBlock *)pPVar23->pnodeBody;
    pFVar35 = local_38;
    pFVar36 = local_40;
    break;
  case knopTryFinally:
    pPVar10 = ParseNode::AsParseNodeTryFinally(pnode);
    pFVar36 = local_40;
    prefix_09.m_fn = prefix_02.m_fn;
    prefix_09.m_context = local_38;
    postfix_09.m_fn = postfix_02.m_fn;
    postfix_09.m_context = local_40;
    Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
              ((ParseNode *)pPVar10->pnodeTry,byteCodeGenerator,prefix_09,postfix_09,pnode);
    pPVar11 = (ParseNodeTryCatch *)ParseNode::AsParseNodeTryFinally(pnode);
LAB_008361fd:
    pPVar16 = (ParseNodeBlock *)pPVar11->pnodeCatch;
    pFVar35 = local_38;
    break;
  case knopArrayPattern:
    if (byteCodeGenerator->inDestructuredPattern == false) {
      byteCodeGenerator->inDestructuredPattern = true;
      pPVar33 = ParseNode::AsParseNodeUni(pnode);
      prefix_41.m_fn = prefix_02.m_fn;
      prefix_41.m_context = local_38;
      postfix_42.m_fn = postfix_02.m_fn;
      postfix_42.m_context = local_40;
      Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
                (pPVar33->pnode1,byteCodeGenerator,prefix_41,postfix_42,(ParseNode *)0x0);
      byteCodeGenerator->inDestructuredPattern = false;
      goto switchD_00835e1a_caseD_55;
    }
    goto switchD_00835e1a_caseD_6d;
  case knopParamPattern:
    pPVar14 = ParseNode::AsParseNodeParamPattern(pnode);
    goto LAB_008364be;
  case knopExportDefault:
    pPVar14 = (ParseNodeParamPattern *)ParseNode::AsParseNodeExportDefault(pnode);
    goto LAB_008364be;
  default:
    if (OVar1 == knopTypeof) {
      pPVar33 = ParseNode::AsParseNodeUni(pnode);
      pPVar16 = (ParseNodeBlock *)pPVar33->pnode1;
      goto LAB_00836aa4;
    }
    if (OVar1 != knopArray) goto switchD_00835e1a_caseD_30;
    bVar3 = EmitAsConstantArray(pnode,byteCodeGenerator);
    if (bVar3) goto switchD_00835e1a_caseD_55;
switchD_00835e1a_caseD_6d:
    pPVar14 = (ParseNodeParamPattern *)ParseNode::AsParseNodeUni(pnode);
LAB_008364be:
    pPVar16 = (ParseNodeBlock *)(pPVar14->super_ParseNodeUni).pnode1;
LAB_008364c2:
    pFVar35 = local_38;
    pFVar36 = local_40;
    pPVar17 = (ParseNode *)0x0;
  }
  prefix_20.m_fn = p_Var34;
  prefix_20.m_context = pFVar35;
  postfix_20.m_fn = postfix_02.m_fn;
  postfix_20.m_context = pFVar36;
  Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
            ((ParseNode *)pPVar16,byteCodeGenerator,prefix_20,postfix_20,pPVar17);
switchD_00835e1a_caseD_55:
  if (pnodeParent != (ParseNode *)0x0) {
    PropagateFlags(pnode,pnodeParent);
  }
  if (postfix_02.m_fn != (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_FuncInfo_ptr *)0x0) {
    (*postfix_02.m_fn)(pnode,byteCodeGenerator,local_40);
  }
  return;
}

Assistant:

void Visit(ParseNode *pnode, ByteCodeGenerator* byteCodeGenerator, PrefixFn prefix, PostfixFn postfix, ParseNode *pnodeParent)
{
    if (pnode == nullptr)
    {
        return;
    }

    ThreadContext::ProbeCurrentStackNoDispose(Js::Constants::MinStackByteCodeVisitor, byteCodeGenerator->GetScriptContext());

    prefix(pnode, byteCodeGenerator);
    switch (pnode->nop)
    {
    default:
    {
        uint flags = ParseNode::Grfnop(pnode->nop);
        if (flags&fnopUni)
        {
            Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
        }
        else if (flags&fnopBin)
        {
            Visit(pnode->AsParseNodeBin()->pnode1, byteCodeGenerator, prefix, postfix);
            Visit(pnode->AsParseNodeBin()->pnode2, byteCodeGenerator, prefix, postfix);

            if (ByteCodeGenerator::IsSuper(pnode->AsParseNodeBin()->pnode1))
            {
                Visit(pnode->AsParseNodeSuperReference()->pnodeThis, byteCodeGenerator, prefix, postfix);
            }
        }

        break;
    }

    case knopParamPattern:
        Visit(pnode->AsParseNodeParamPattern()->pnode1, byteCodeGenerator, prefix, postfix);
        break;

    case knopArrayPattern:
        if (!byteCodeGenerator->InDestructuredPattern())
        {
            byteCodeGenerator->SetInDestructuredPattern(true);
            Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
            byteCodeGenerator->SetInDestructuredPattern(false);
        }
        else
        {
            Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
        }
        break;

    case knopCall:
        Visit(pnode->AsParseNodeCall()->pnodeTarget, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeCall()->pnodeArgs, byteCodeGenerator, prefix, postfix);

        if (pnode->AsParseNodeCall()->isSuperCall)
        {
            Visit(pnode->AsParseNodeSuperCall()->pnodeThis, byteCodeGenerator, prefix, postfix);
            Visit(pnode->AsParseNodeSuperCall()->pnodeNewTarget, byteCodeGenerator, prefix, postfix);
        }
        break;

    case knopNew:
    {
        Visit(pnode->AsParseNodeCall()->pnodeTarget, byteCodeGenerator, prefix, postfix);
        if (!IsCallOfConstants(pnode))
        {
            Visit(pnode->AsParseNodeCall()->pnodeArgs, byteCodeGenerator, prefix, postfix);
        }
        break;
    }

    case knopQmark:
        Visit(pnode->AsParseNodeTri()->pnode1, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeTri()->pnode2, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeTri()->pnode3, byteCodeGenerator, prefix, postfix);
        break;
    case knopList:
        VisitList(pnode, byteCodeGenerator, prefix, postfix);
        break;
    // PTNODE(knopVarDecl    , "varDcl"    ,None    ,Var  ,fnopNone)
    case knopVarDecl:
    case knopConstDecl:
    case knopLetDecl:
        if (pnode->AsParseNodeVar()->pnodeInit != nullptr)
            Visit(pnode->AsParseNodeVar()->pnodeInit, byteCodeGenerator, prefix, postfix);
        break;
    // PTNODE(knopFncDecl    , "fncDcl"    ,None    ,Fnc  ,fnopLeaf)
    case knopFncDecl:
    {
        // Inner function declarations are visited before anything else in the scope.
        // (See VisitFunctionsInScope.)
        break;
    }
    case knopClassDecl:
    {
        Visit(pnode->AsParseNodeClass()->pnodeDeclName, byteCodeGenerator, prefix, postfix);
        // Now visit the class name and methods.
        BeginVisitBlock(pnode->AsParseNodeClass()->pnodeBlock, byteCodeGenerator);
        // The extends clause is bound to the scope which contains the class name
        // (and the class name identifier is in a TDZ when the extends clause is evaluated).
        // See ES 2017 14.5.13 Runtime Semantics: ClassDefinitionEvaluation.
        Visit(pnode->AsParseNodeClass()->pnodeExtends, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeClass()->pnodeName, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeClass()->pnodeConstructor, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeClass()->pnodeMembers, byteCodeGenerator, prefix, postfix);
        EndVisitBlock(pnode->AsParseNodeClass()->pnodeBlock, byteCodeGenerator);
        break;
    }
    case knopStrTemplate:
    {
        // Visit the string node lists only if we do not have a tagged template.
        // We never need to visit the raw strings as they are not used in non-tagged templates and
        // tagged templates will register them as part of the callsite constant object.
        if (!pnode->AsParseNodeStrTemplate()->isTaggedTemplate)
        {
            Visit(pnode->AsParseNodeStrTemplate()->pnodeStringLiterals, byteCodeGenerator, prefix, postfix);
        }
        Visit(pnode->AsParseNodeStrTemplate()->pnodeSubstitutionExpressions, byteCodeGenerator, prefix, postfix);
        break;
    }
    case knopExportDefault:
        Visit(pnode->AsParseNodeExportDefault()->pnodeExpr, byteCodeGenerator, prefix, postfix);
        break;
    // PTNODE(knopProg       , "program"    ,None    ,Fnc  ,fnopNone)
    case knopProg:
    {
        // We expect that the global statements have been generated (meaning that the pnodeFncs
        // field is a real pointer, not an enumeration).
        Assert(pnode->AsParseNodeFnc()->pnodeBody);

        uint i = 0;
        VisitNestedScopes(pnode->AsParseNodeFnc()->pnodeScopes, pnode, byteCodeGenerator, prefix, postfix, &i);
        // Visiting global code: track the last value statement.
        BeginVisitBlock(pnode->AsParseNodeFnc()->pnodeScopes, byteCodeGenerator);
        pnode->AsParseNodeProg()->pnodeLastValStmt = VisitBlock(pnode->AsParseNodeFnc()->pnodeBody, byteCodeGenerator, prefix, postfix);
        EndVisitBlock(pnode->AsParseNodeFnc()->pnodeScopes, byteCodeGenerator);

        break;
    }
    case knopFor:
        BeginVisitBlock(pnode->AsParseNodeFor()->pnodeBlock, byteCodeGenerator);
        Visit(pnode->AsParseNodeFor()->pnodeInit, byteCodeGenerator, prefix, postfix);
        byteCodeGenerator->EnterLoop();
        Visit(pnode->AsParseNodeFor()->pnodeCond, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeFor()->pnodeIncr, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeFor()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        byteCodeGenerator->ExitLoop();
        EndVisitBlock(pnode->AsParseNodeFor()->pnodeBlock, byteCodeGenerator);
        break;
    // PTNODE(knopIf         , "if"        ,None    ,If   ,fnopNone)
    case knopIf:
        Visit(pnode->AsParseNodeIf()->pnodeCond, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeIf()->pnodeTrue, byteCodeGenerator, prefix, postfix, pnode);
        if (pnode->AsParseNodeIf()->pnodeFalse != nullptr)
        {
            Visit(pnode->AsParseNodeIf()->pnodeFalse, byteCodeGenerator, prefix, postfix, pnode);
        }
        break;
    // PTNODE(knopWhile      , "while"        ,None    ,While,fnopBreak|fnopContinue)
    // PTNODE(knopDoWhile    , "do-while"    ,None    ,While,fnopBreak|fnopContinue)
    case knopDoWhile:
    case knopWhile:
        byteCodeGenerator->EnterLoop();
        Visit(pnode->AsParseNodeWhile()->pnodeCond, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeWhile()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        byteCodeGenerator->ExitLoop();
        break;
    // PTNODE(knopForIn      , "for in"    ,None    ,ForIn,fnopBreak|fnopContinue|fnopCleanup)
    case knopForIn:
    case knopForOf:
    case knopForAwaitOf:
        BeginVisitBlock(pnode->AsParseNodeForInOrForOf()->pnodeBlock, byteCodeGenerator);
        Visit(pnode->AsParseNodeForInOrForOf()->pnodeLval, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeForInOrForOf()->pnodeObj, byteCodeGenerator, prefix, postfix);
        byteCodeGenerator->EnterLoop();
        Visit(pnode->AsParseNodeForInOrForOf()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        byteCodeGenerator->ExitLoop();
        EndVisitBlock(pnode->AsParseNodeForInOrForOf()->pnodeBlock, byteCodeGenerator);
        break;
    // PTNODE(knopReturn     , "return"    ,None    ,Uni  ,fnopNone)
    case knopReturn:
        if (pnode->AsParseNodeReturn()->pnodeExpr != nullptr)
            Visit(pnode->AsParseNodeReturn()->pnodeExpr, byteCodeGenerator, prefix, postfix);
        break;
    // PTNODE(knopBlock      , "{}"        ,None    ,Block,fnopNone)
    case knopBlock:
    {
        ParseNodeBlock * pnodeBlock = pnode->AsParseNodeBlock();
        if (pnodeBlock->pnodeStmt != nullptr)
        {
            BeginVisitBlock(pnodeBlock, byteCodeGenerator);
            pnodeBlock->pnodeLastValStmt = VisitBlock(pnodeBlock->pnodeStmt, byteCodeGenerator, prefix, postfix, pnode);
            EndVisitBlock(pnodeBlock, byteCodeGenerator);
        }
        else
        {
            pnodeBlock->pnodeLastValStmt = nullptr;
        }
        break;
    }
    // PTNODE(knopWith       , "with"        ,None    ,With ,fnopCleanup)
    case knopWith:
        Visit(pnode->AsParseNodeWith()->pnodeObj, byteCodeGenerator, prefix, postfix);
        VisitWithStmt(pnode, pnode->AsParseNodeWith()->pnodeObj->location, byteCodeGenerator, prefix, postfix, pnode);
        break;
    // PTNODE(knopBreak      , "break"        ,None    ,Jump ,fnopNone)
    case knopBreak:
        // TODO: some representation of target
        break;
    // PTNODE(knopContinue   , "continue"    ,None    ,Jump ,fnopNone)
    case knopContinue:
        // TODO: some representation of target
        break;
    // PTNODE(knopSwitch     , "switch"    ,None    ,Switch,fnopBreak)
    case knopSwitch:
        Visit(pnode->AsParseNodeSwitch()->pnodeVal, byteCodeGenerator, prefix, postfix);
        BeginVisitBlock(pnode->AsParseNodeSwitch()->pnodeBlock, byteCodeGenerator);
        for (ParseNodeCase *pnodeT = pnode->AsParseNodeSwitch()->pnodeCases; nullptr != pnodeT; pnodeT = pnodeT->pnodeNext)
        {
            Visit(pnodeT, byteCodeGenerator, prefix, postfix, pnode);
        }
        Visit(pnode->AsParseNodeSwitch()->pnodeBlock, byteCodeGenerator, prefix, postfix);
        EndVisitBlock(pnode->AsParseNodeSwitch()->pnodeBlock, byteCodeGenerator);
        break;
    // PTNODE(knopCase       , "case"        ,None    ,Case ,fnopNone)
    case knopCase:
        Visit(pnode->AsParseNodeCase()->pnodeExpr, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeCase()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        break;
    case knopTypeof:
        Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
        break;
    // PTNODE(knopTryCatchFinally,"try-catch-finally",None,TryCatchFinally,fnopCleanup)
    case knopTryFinally:
        Visit(pnode->AsParseNodeTryFinally()->pnodeTry, byteCodeGenerator, prefix, postfix, pnode);
        Visit(pnode->AsParseNodeTryFinally()->pnodeFinally, byteCodeGenerator, prefix, postfix, pnode);
        break;
    // PTNODE(knopTryCatch      , "try-catch" ,None    ,TryCatch  ,fnopCleanup)
    case knopTryCatch:
        Visit(pnode->AsParseNodeTryCatch()->pnodeTry, byteCodeGenerator, prefix, postfix, pnode);
        Visit(pnode->AsParseNodeTryCatch()->pnodeCatch, byteCodeGenerator, prefix, postfix, pnode);
        break;
    // PTNODE(knopTry        , "try"       ,None    ,Try  ,fnopCleanup)
    case knopTry:
        Visit(pnode->AsParseNodeTry()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        break;
    case knopCatch:
        BeginVisitCatch(pnode, byteCodeGenerator);
        Visit(pnode->AsParseNodeCatch()->GetParam(), byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeCatch()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        EndVisitCatch(pnode, byteCodeGenerator);
        break;
    case knopFinally:
        Visit(pnode->AsParseNodeFinally()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        break;
    // PTNODE(knopThrow      , "throw"     ,None    ,Uni  ,fnopNone)
    case knopThrow:
        Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
        break;
    case knopArray:
    {
        bool arrayLitOpt = EmitAsConstantArray(pnode, byteCodeGenerator);
        if (!arrayLitOpt)
        {
            Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
        }
        break;
    }
    case knopComma:
    {
        ParseNode *pnode1 = pnode->AsParseNodeBin()->pnode1;
        if (pnode1->nop == knopComma)
        {
            // Spot-fix to avoid recursion on very large comma expressions.
            ArenaAllocator *alloc = byteCodeGenerator->GetAllocator();
            SList<ParseNode*> rhsStack(alloc);
            do
            {
                rhsStack.Push(pnode1->AsParseNodeBin()->pnode2);
                pnode1 = pnode1->AsParseNodeBin()->pnode1;
            }
            while (pnode1->nop == knopComma);

            Visit(pnode1, byteCodeGenerator, prefix, postfix);
            while (!rhsStack.Empty())
            {
                ParseNode *pnodeRhs = rhsStack.Pop();
                Visit(pnodeRhs, byteCodeGenerator, prefix, postfix);
            }
        }
        else
        {
            Visit(pnode1, byteCodeGenerator, prefix, postfix);
        }
        Visit(pnode->AsParseNodeBin()->pnode2, byteCodeGenerator, prefix, postfix);
    }
        break;
    }
    if (pnodeParent)
    {
        PropagateFlags(pnode, pnodeParent);
    }
    postfix(pnode, byteCodeGenerator);
}